

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

void __thiscall fasttext::Vector::addVector(Vector *this,Vector *source,real s)

{
  ulong uVar1;
  float *pfVar2;
  float *pfVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  undefined1 in_register_00001204 [12];
  
  uVar1 = (this->data_).size_;
  if (uVar1 == (source->data_).size_) {
    pfVar2 = (source->data_).mem_;
    pfVar3 = (this->data_).mem_;
    for (uVar5 = 0; (~((long)uVar1 >> 0x3f) & uVar1) != uVar5; uVar5 = uVar5 + 1) {
      auVar4._4_12_ = in_register_00001204;
      auVar4._0_4_ = s;
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)pfVar2[uVar5]),auVar4,ZEXT416((uint)pfVar3[uVar5]));
      pfVar3[uVar5] = auVar4._0_4_;
    }
    return;
  }
  __assert_fail("size() == source.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/vector.cc"
                ,0x30,"void fasttext::Vector::addVector(const Vector &, real)");
}

Assistant:

void Vector::addVector(const Vector& source, real s) {
  assert(size() == source.size());
  for (int64_t i = 0; i < size(); i++) {
    data_[i] += s * source.data_[i];
  }
}